

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  char *pcVar1;
  int iVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  slot_type *psVar5;
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  uint uVar9;
  char cVar10;
  slot_type *psVar11;
  slot_type *psVar12;
  bool bVar13;
  byte bVar14;
  uint uVar15;
  slot_type *psVar16;
  ulong extraout_RDX;
  ulong uVar17;
  ushort uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  ulong uStack_58;
  char cVar23;
  char cVar25;
  char cVar26;
  char cVar27;
  
  psVar3 = (slot_type *)a->ctrl_;
  if ((psVar3 == (slot_type *)(kEmptyGroup + 0x10) || psVar3 == (slot_type *)0x0) ||
     (kSentinel < *(ctrl_t *)psVar3)) {
    psVar4 = (slot_type *)b->ctrl_;
    if ((psVar4 != (slot_type *)(kEmptyGroup + 0x10) && psVar4 != (slot_type *)0x0) &&
       (*(ctrl_t *)psVar4 < ~kSentinel)) goto LAB_0019d36a;
    if (psVar3 == (slot_type *)(kEmptyGroup + 0x10) && psVar4 == (slot_type *)(kEmptyGroup + 0x10))
    {
LAB_0019d35d:
      return psVar3 == psVar4;
    }
    if ((psVar3 == (slot_type *)(kEmptyGroup + 0x10)) ==
        (psVar4 == (slot_type *)(kEmptyGroup + 0x10))) {
      if (psVar3 == (slot_type *)0x0 || psVar4 == (slot_type *)0x0) goto LAB_0019d35d;
      if ((psVar4 == (slot_type *)kSooControl) == (psVar3 == (slot_type *)kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar5 = (b->field_1).slot_;
        if (psVar3 == (slot_type *)kSooControl) {
          bVar13 = (slot_type *)a == psVar5;
        }
        else {
          psVar16 = psVar5;
          psVar11 = psVar4;
          psVar12 = (slot_type *)a;
          if (psVar4 < psVar3) {
            psVar16 = (slot_type *)a;
            psVar11 = psVar3;
            psVar12 = psVar5;
          }
          b = (iterator *)CONCAT71((int7)((ulong)psVar11 >> 8),psVar11 < psVar12);
          bVar13 = psVar12 <= psVar16 && psVar11 < psVar12;
        }
        if (bVar13) goto LAB_0019d35d;
      }
      goto LAB_0019d374;
    }
  }
  else {
    operator==();
LAB_0019d36a:
    operator==();
  }
  operator==();
LAB_0019d374:
  operator==();
  uVar6 = *(ulong *)a;
  if ((uVar6 + 1 & uVar6) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar7 = (((value_type *)a)->second)._M_string_length;
  uVar17 = (extraout_RDX >> 7 ^ uVar7 >> 0xc) & uVar6;
  bVar14 = (byte)extraout_RDX;
  uVar20 = (ulong)(bVar14 & 0x7f);
  auVar21 = ZEXT216(CONCAT11(bVar14,bVar14) & 0x7f7f);
  auVar21 = pshuflw(auVar21,auVar21,0);
  uStack_58 = 0;
  do {
    pcVar1 = (char *)(uVar7 + uVar17);
    cVar10 = pcVar1[0xf];
    cVar23 = auVar21[0];
    auVar24[0] = -(cVar23 == *pcVar1);
    cVar25 = auVar21[1];
    auVar24[1] = -(cVar25 == pcVar1[1]);
    cVar26 = auVar21[2];
    auVar24[2] = -(cVar26 == pcVar1[2]);
    cVar27 = auVar21[3];
    auVar24[3] = -(cVar27 == pcVar1[3]);
    auVar24[4] = -(cVar23 == pcVar1[4]);
    auVar24[5] = -(cVar25 == pcVar1[5]);
    auVar24[6] = -(cVar26 == pcVar1[6]);
    auVar24[7] = -(cVar27 == pcVar1[7]);
    auVar24[8] = -(cVar23 == pcVar1[8]);
    auVar24[9] = -(cVar25 == pcVar1[9]);
    auVar24[10] = -(cVar26 == pcVar1[10]);
    auVar24[0xb] = -(cVar27 == pcVar1[0xb]);
    auVar24[0xc] = -(cVar23 == pcVar1[0xc]);
    auVar24[0xd] = -(cVar25 == pcVar1[0xd]);
    auVar24[0xe] = -(cVar26 == pcVar1[0xe]);
    auVar24[0xf] = -(cVar27 == cVar10);
    uVar18 = (ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe | (ushort)(auVar24[0xf] >> 7) << 0xf;
    uVar15 = (uint)uVar18;
    bVar13 = uVar18 == 0;
    if (!bVar13) {
      sVar8 = (((value_type *)a)->second)._M_string_length;
      do {
        uVar9 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar19 = uVar9 + uVar17 & uVar6;
        iVar2 = *(int *)((((value_type *)a)->second).field_2._M_allocated_capacity + uVar19 * 0x28);
        if (iVar2 == *(int *)&b->ctrl_) {
          if (sVar8 == 0) {
            __assert_fail("ctrl != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x9ef,
                          "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::basic_string<char>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::basic_string<char>>>]"
                         );
          }
          uVar20 = uVar19 + sVar8;
        }
        if (iVar2 == *(int *)&b->ctrl_) break;
        uVar18 = (ushort)(uVar15 - 1) & (ushort)uVar15;
        uVar15 = CONCAT22((short)(uVar15 - 1 >> 0x10),uVar18);
        bVar13 = uVar18 == 0;
      } while (!bVar13);
    }
    if (bVar13) {
      auVar22[0] = -(*pcVar1 == -0x80);
      auVar22[1] = -(pcVar1[1] == -0x80);
      auVar22[2] = -(pcVar1[2] == -0x80);
      auVar22[3] = -(pcVar1[3] == -0x80);
      auVar22[4] = -(pcVar1[4] == -0x80);
      auVar22[5] = -(pcVar1[5] == -0x80);
      auVar22[6] = -(pcVar1[6] == -0x80);
      auVar22[7] = -(pcVar1[7] == -0x80);
      auVar22[8] = -(pcVar1[8] == -0x80);
      auVar22[9] = -(pcVar1[9] == -0x80);
      auVar22[10] = -(pcVar1[10] == -0x80);
      auVar22[0xb] = -(pcVar1[0xb] == -0x80);
      auVar22[0xc] = -(pcVar1[0xc] == -0x80);
      auVar22[0xd] = -(pcVar1[0xd] == -0x80);
      auVar22[0xe] = -(pcVar1[0xe] == -0x80);
      auVar22[0xf] = -(cVar10 == -0x80);
      if ((((((((((((((((auVar22 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar22 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar22 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar22 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar22 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar22 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar22 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar22 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar22 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar22 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar22 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar22 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar10 == -0x80) {
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)a);
        uVar20 = 0;
        goto LAB_0019d467;
      }
      if (*(ulong *)a < uStack_58 + 0x10) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::basic_string<char>>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::basic_string<char>>>, K = int]"
                     );
      }
      uVar17 = uVar17 + uStack_58 + 0x10 & uVar6;
      bVar13 = true;
      uStack_58 = uStack_58 + 0x10;
    }
    else {
LAB_0019d467:
      bVar13 = false;
    }
    if (!bVar13) {
      return SUB81(uVar20,0);
    }
  } while( true );
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }